

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O1

void bakeSWU2(word *W,ec_o *ec,octet *X,void *stack)

{
  size_t sVar1;
  void *state;
  
  sVar1 = ec->f->no;
  state = (void *)((long)stack + sVar1 + 0x10);
  memSet((void *)((long)stack + sVar1),'\0',0x10);
  beltWBLStart(state,(octet *)(ec->f->no + (long)stack),0x10);
  memCopy(stack,X,ec->f->no);
  beltWBLStepE(stack,ec->f->no + 0x10,state);
  u64From((u64 *)stack,stack,ec->f->no + 0x10);
  sVar1 = ec->f->n;
  zzMod((word *)stack,(word *)stack,sVar1 + 2,ec->f->mod,sVar1,state);
  u64To(stack,ec->f->no,(u64 *)stack);
  (*ec->f->from)((word *)stack,(octet *)stack,ec->f,state);
  ecpSWU(W,(word *)stack,ec,state);
  return;
}

Assistant:

static void bakeSWU2(word W[], const ec_o* ec, const octet X[], void* stack)
{
	octet* H;	/* [no + 16] */
	word* s;	/* [n + W_OF_O(16)] (совпадает с H) */
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(memIsValid(X, ec->f->no));
	ASSERT(wwIsValid(W, 2 * ec->f->n));
	// раскладка stack
	H = (octet*)stack;
	s = (word*)stack;
	stack = H + ec->f->no + 16;
	// H <- beltWBL(X, 0, 0)
	memSetZero(H + ec->f->no, 16);
	beltWBLStart(stack, H + ec->f->no, 16);
	memCopy(H, X, ec->f->no);
	beltWBLStepE(H, ec->f->no + 16, stack);
	// s <- \bar H mod p
	wwFrom(s, H, ec->f->no + 16);
	zzMod(s, s, ec->f->n + W_OF_O(16), ec->f->mod, ec->f->n, stack);
	// W <- ecpSWU(s)
	wwTo(H, ec->f->no, s);
	qrFrom(s, H, ec->f, stack);
	ecpSWU(W, s, ec, stack);
}